

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

bool __thiscall
QWidgetPrivate::updateBrushOrigin(QWidgetPrivate *this,QPainter *painter,QBrush *brush)

{
  uint uVar1;
  long lVar2;
  QWidget *pQVar3;
  QAbstractScrollArea *this_00;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(*(long *)brush + 4);
  if (1 < uVar1) {
    pQVar3 = *(QWidget **)&this->field_0x8;
    this_00 = (QAbstractScrollArea *)
              QMetaObject::cast((QObject *)&QAbstractScrollArea::staticMetaObject);
    if (this_00 != (QAbstractScrollArea *)0x0) {
      pQVar4 = QAbstractScrollArea::viewport(this_00);
      if (pQVar4 == pQVar3) {
        (**(code **)(**(long **)(this_00 + 8) + 0xb8))();
        QPainter::setBrushOrigin((QPointF *)painter);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return 1 < uVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetPrivate::updateBrushOrigin(QPainter *painter, const QBrush &brush) const
{
#if QT_CONFIG(scrollarea)
    Q_Q(const QWidget);
    //If we are painting the viewport of a scrollarea, we must apply an offset to the brush in case we are drawing a texture
    if (brush.style() == Qt::NoBrush || brush.style() == Qt::SolidPattern)
        return false;
    QAbstractScrollArea *scrollArea = qobject_cast<QAbstractScrollArea *>(parent);
    if (scrollArea && scrollArea->viewport() == q) {
        QObjectData *scrollPrivate = static_cast<QWidget *>(scrollArea)->d_ptr.data();
        QAbstractScrollAreaPrivate *priv = static_cast<QAbstractScrollAreaPrivate *>(scrollPrivate);
        painter->setBrushOrigin(-priv->contentsOffset());
    }
#endif // QT_CONFIG(scrollarea)
    return true;
}